

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O3

void spot_free(Spot *spot)

{
  ulong uVar1;
  
  if (spot->cardsCount != '\0') {
    uVar1 = 0;
    do {
      card_free(spot->cards[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < spot->cardsCount);
  }
  free(spot->cards);
  free(spot);
  return;
}

Assistant:

void spot_free(Spot * spot)
{
	unsigned char i;
	for(i=0;i<spot->cardsCount;i++)
	{
		card_free(spot->cards[i]);
	}
	free(spot->cards);
	free(spot);
}